

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::DefaultSampling<tcu::Vector<int,_4>_>::genFixeds
          (DefaultSampling<tcu::Vector<int,_4>_> *this,FloatFormat *fmt,
          vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *dst)

{
  ulong uVar1;
  vector<int,_std::allocator<int>_> scalars;
  undefined1 local_48 [16];
  pointer local_38;
  Vector<int,_4> local_28;
  
  local_48 = (undefined1  [16])0x0;
  local_38 = (pointer)0x0;
  DefaultSampling<int>::genFixeds
            ((DefaultSampling<int> *)
             &instance<deqp::gls::BuiltinPrecisionTests::DefaultSampling<int>>()::s_instance,fmt,
             (vector<int,_std::allocator<int>_> *)local_48);
  if (local_48._8_8_ != local_48._0_8_) {
    uVar1 = 0;
    do {
      local_28.m_data[0] = *(pointer)(local_48._0_8_ + uVar1 * 4);
      local_28.m_data[1] = local_28.m_data[0];
      local_28.m_data[2] = local_28.m_data[0];
      local_28.m_data[3] = local_28.m_data[0];
      std::vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>>::
      emplace_back<tcu::Vector<int,4>>
                ((vector<tcu::Vector<int,4>,std::allocator<tcu::Vector<int,4>>> *)dst,&local_28);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)((long)(local_48._8_8_ - local_48._0_8_) >> 2));
  }
  if ((pointer)local_48._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_48._0_8_,(long)local_38 - local_48._0_8_);
  }
  return;
}

Assistant:

void	genFixeds	(const FloatFormat& fmt, vector<Value>& dst) const
	{
		vector<T> scalars;

		instance<DefaultSampling<T> >().genFixeds(fmt, scalars);

		for (size_t scalarNdx = 0; scalarNdx < scalars.size(); ++scalarNdx)
			dst.push_back(Value(scalars[scalarNdx]));
	}